

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_start_seq(Parser *this,bool as_child)

{
  undefined1 uVar1;
  State *pSVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  NodeData *pNVar11;
  size_t *psVar12;
  Tree *pTVar13;
  ulong uVar14;
  NodeData *pNVar15;
  size_t ichild;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  Tree *pTVar21;
  ulong uVar22;
  NodeType_e NVar23;
  byte bVar24;
  csubstr cVar25;
  char msg [58];
  char local_148 [24];
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined4 uStack_12c;
  undefined2 local_128;
  undefined6 uStack_126;
  undefined2 uStack_120;
  undefined6 uStack_11e;
  undefined2 uStack_118;
  char acStack_116 [22];
  undefined4 local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar24 = 0;
  pSVar2 = this->m_state;
  uVar16 = pSVar2->flags;
  if ((~uVar16 & 3) == 0) {
    sVar20 = (this->m_key_tag).len;
    (this->m_val_tag).str = (this->m_key_tag).str;
    (this->m_val_tag).len = sVar20;
    (this->m_key_tag).str = (char *)0x0;
    (this->m_key_tag).len = 0;
    uVar16 = pSVar2->flags;
  }
  pSVar2->flags = uVar16 & 0xffffff75 | 0x88;
  if ((this->m_stack).m_size == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_148[0] = '\0';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    local_148[4] = '\0';
    local_148[5] = '\0';
    local_148[6] = '\0';
    local_148[7] = '\0';
    local_148[8] = '_';
    local_148[9] = '\\';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    local_148[0x10] = '\0';
    local_148[0x11] = '\0';
    local_148[0x12] = '\0';
    local_148[0x13] = '\0';
    local_148[0x14] = '\0';
    local_148[0x15] = '\0';
    local_148[0x16] = '\0';
    local_148[0x17] = '\0';
    uStack_130 = 0x4288;
    uStack_12e = 0x21;
    uStack_12c = 0;
    local_128 = 0x65;
    uStack_126 = 0;
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pTVar21 = this->m_tree;
  uVar22 = ((this->m_stack).m_stack)->node_id;
  if (uVar22 == 0xffffffffffffffff) {
    pNVar15 = (NodeData *)0x0;
  }
  else {
    pTVar13 = pTVar21;
    if (pTVar21->m_cap <= uVar22) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
      pTVar13 = this->m_tree;
    }
    pNVar15 = pTVar21->m_buf + uVar22;
    pTVar21 = pTVar13;
  }
  uVar22 = this->m_root_id;
  if (uVar22 == 0xffffffffffffffff) {
    pNVar11 = (NodeData *)0x0;
  }
  else {
    if (pTVar21->m_cap <= uVar22) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar11 = pTVar21->m_buf + uVar22;
  }
  if (pNVar15 != pNVar11) {
    uStack_118 = 0x6f72;
    builtin_strncpy(acStack_116,"ot_id))",8);
    local_128 = 0x6d6f;
    uStack_126 = 0x3d3d20292928;
    uStack_120 = 0x6e20;
    uStack_11e = 0x5f6d2865646f;
    builtin_strncpy(local_148 + 0x10,"ode(m_st",8);
    uStack_130 = 0x6361;
    uStack_12e = 0x2e6b;
    uStack_12c = 0x74746f62;
    builtin_strncpy(local_148,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_58 = 0;
    uStack_50 = 0x7883;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7883) << 0x40);
    LVar4.name.str._0_4_ = 0x214288;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_148,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar22 = (this->m_stack).m_size;
  psVar12 = &(this->m_stack).m_stack[uVar22 - 2].node_id;
  if (uVar22 < 2) {
    psVar12 = &this->m_root_id;
  }
  uVar22 = *psVar12;
  if (uVar22 == 0xffffffffffffffff) {
    builtin_strncpy(local_148 + 0x10,"arent_id",8);
    uStack_130 = 0x2120;
    uStack_12e = 0x203d;
    uStack_12c = 0x454e4f4e;
    builtin_strncpy(local_148,"check failed: (p",0x10);
    local_128 = 0x29;
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_80 = 0;
    uStack_78 = 0x7885;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7885) << 0x40);
    LVar6.name.str._0_4_ = 0x214288;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_148,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar14 = this->m_state->node_id;
  if (uVar14 != 0xffffffffffffffff) {
    pTVar21 = this->m_tree;
    if (pTVar21->m_cap <= uVar14) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar21->m_buf != (NodeData *)0x0) {
      pTVar21 = this->m_tree;
      uVar14 = this->m_state->node_id;
      if (uVar14 == 0xffffffffffffffff) {
        pNVar15 = (NodeData *)0x0;
      }
      else {
        pTVar13 = pTVar21;
        if (pTVar21->m_cap <= uVar14) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_148[0] = '\0';
          local_148[1] = '\0';
          local_148[2] = '\0';
          local_148[3] = '\0';
          local_148[4] = '\0';
          local_148[5] = '\0';
          local_148[6] = '\0';
          local_148[7] = '\0';
          local_148[8] = 't';
          local_148[9] = 'K';
          local_148[10] = '\0';
          local_148[0xb] = '\0';
          local_148[0xc] = '\0';
          local_148[0xd] = '\0';
          local_148[0xe] = '\0';
          local_148[0xf] = '\0';
          local_148[0x10] = '\0';
          local_148[0x11] = '\0';
          local_148[0x12] = '\0';
          local_148[0x13] = '\0';
          local_148[0x14] = '\0';
          local_148[0x15] = '\0';
          local_148[0x16] = '\0';
          local_148[0x17] = '\0';
          uStack_130 = 0x4288;
          uStack_12e = 0x21;
          uStack_12c = 0;
          local_128 = 0x65;
          uStack_126 = 0;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          pTVar13 = this->m_tree;
        }
        pNVar15 = pTVar21->m_buf + uVar14;
        pTVar21 = pTVar13;
      }
      uVar14 = this->m_root_id;
      if (uVar14 == 0xffffffffffffffff) {
        pNVar11 = (NodeData *)0x0;
      }
      else {
        if (pTVar21->m_cap <= uVar14) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_148[0] = '\0';
          local_148[1] = '\0';
          local_148[2] = '\0';
          local_148[3] = '\0';
          local_148[4] = '\0';
          local_148[5] = '\0';
          local_148[6] = '\0';
          local_148[7] = '\0';
          local_148[8] = 't';
          local_148[9] = 'K';
          local_148[10] = '\0';
          local_148[0xb] = '\0';
          local_148[0xc] = '\0';
          local_148[0xd] = '\0';
          local_148[0xe] = '\0';
          local_148[0xf] = '\0';
          local_148[0x10] = '\0';
          local_148[0x11] = '\0';
          local_148[0x12] = '\0';
          local_148[0x13] = '\0';
          local_148[0x14] = '\0';
          local_148[0x15] = '\0';
          local_148[0x16] = '\0';
          local_148[0x17] = '\0';
          uStack_130 = 0x4288;
          uStack_12e = 0x21;
          uStack_12c = 0;
          local_128 = 0x65;
          uStack_126 = 0;
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar11 = pTVar21->m_buf + uVar14;
      }
      if (pNVar15 != pNVar11) {
        pcVar18 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar19 = local_148;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(undefined8 *)pcVar19 = *(undefined8 *)pcVar18;
          pcVar18 = pcVar18 + ((ulong)bVar24 * -2 + 1) * 8;
          pcVar19 = pcVar19 + ((ulong)bVar24 * -2 + 1) * 8;
        }
        local_fc = 0;
        local_100 = 0x29296469;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8 = 0;
        uStack_a0 = 0x7886;
        local_98 = 0;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x7886) << 0x40);
        LVar7.name.str._0_4_ = 0x214288;
        LVar7.super_LineCol.offset = auVar5._0_8_;
        LVar7.super_LineCol.line = auVar5._8_8_;
        LVar7.super_LineCol.col = auVar5._16_8_;
        LVar7.name.str._4_4_ = 0;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x4d,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (as_child) {
    pTVar21 = this->m_tree;
    uVar14 = pTVar21->m_cap;
    if (uVar22 < uVar14 && uVar22 != 0xffffffffffffffff) {
      pNVar15 = pTVar21->m_buf;
      sVar20 = pNVar15[uVar22].m_last_child;
LAB_001dd06e:
      if (uVar14 <= uVar22) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7a;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pNVar15 = pTVar21->m_buf;
      }
      uVar1 = (undefined1)pNVar15[uVar22].m_type.type;
    }
    else {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7d;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar15 = pTVar21->m_buf;
      sVar20 = pNVar15[uVar22].m_last_child;
      if (uVar22 != 0xffffffffffffffff) {
        uVar14 = pTVar21->m_cap;
        goto LAB_001dd06e;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x4f;
      local_148[9] = 'L';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar1 = (undefined1)pTVar21->m_buf[-1].m_type.type;
    }
    if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar10 = Tree::is_root(pTVar21,uVar22), !bVar10)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x4e;
      local_148[9] = 'L';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (sVar20 != 0xffffffffffffffff) {
      if (pTVar21->m_cap <= sVar20) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7d;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (pTVar21->m_buf[sVar20].m_parent != uVar22) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x4d;
        local_148[9] = 'L';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(pTVar21);
    Tree::_set_hierarchy(pTVar21,ichild,uVar22,sVar20);
    pSVar2 = this->m_state;
    pSVar2->node_id = ichild;
    pTVar21 = this->m_tree;
    if ((pSVar2->flags & 0x200) == 0) {
      if ((ichild == 0xffffffffffffffff) || (pTVar21->m_cap <= ichild)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7a;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar21->m_buf[ichild].m_type.type & DOC) != NOTYPE) {
        local_128 = 0x735f;
        uStack_126 = 0x3e2d65746174;
        uStack_120 = 0x6f6e;
        uStack_11e = 0x2964695f6564;
        builtin_strncpy(local_148 + 0x10,"m_tree->",8);
        uStack_130 = 0x7369;
        uStack_12e = 0x645f;
        uStack_12c = 0x6d28636f;
        builtin_strncpy(local_148,"check failed: (!",0x10);
        uStack_118 = 0x29;
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = 0;
        uStack_f0 = 0x789e;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x789e) << 0x40);
        LVar8.name.str._0_4_ = 0x214288;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x32,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      Tree::to_seq(this->m_tree,this->m_state->node_id,0);
    }
    else {
      if ((uVar22 == 0xffffffffffffffff) || (pTVar21->m_cap <= uVar22)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7a;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar21->m_buf[uVar22].m_type.type & MAP) == NOTYPE) {
        local_128 = 0x6572;
        uStack_126 = 0x2964695f746e;
        uStack_120 = 0x29;
        builtin_strncpy(local_148 + 0x10,"_tree->i",8);
        uStack_130 = 0x5f73;
        uStack_12e = 0x616d;
        uStack_12c = 0x61702870;
        builtin_strncpy(local_148,"check failed: (m",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_d0 = 0;
        uStack_c8 = 0x788c;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x788c) << 0x40);
        LVar9.name.str._0_4_ = 0x214288;
        LVar9.super_LineCol.offset = auVar5._0_8_;
        LVar9.super_LineCol.line = auVar5._8_8_;
        LVar9.super_LineCol.col = auVar5._16_8_;
        LVar9.name.str._4_4_ = 0;
        LVar9.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x2a,LVar9,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar16 = this->m_state->flags;
      cVar25 = _consume_scalar(this);
      Tree::to_seq(this->m_tree,this->m_state->node_id,cVar25,(ulong)((uVar16 & 0x400) << 3));
      _write_key_anchor(this,this->m_state->node_id);
      if ((this->m_key_tag).str != (char *)0x0 && (this->m_key_tag).len != 0) {
        pTVar21 = this->m_tree;
        sVar20 = this->m_state->node_id;
        cVar25 = normalize_tag(this->m_key_tag);
        Tree::set_key_tag(pTVar21,sVar20,cVar25);
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
      }
    }
    _write_val_anchor(this,this->m_state->node_id);
    uVar22 = this->m_state->node_id;
    pcVar18 = (this->m_state->line_contents).rem.str;
    pTVar21 = this->m_tree;
    if ((uVar22 != 0xffffffffffffffff) && (uVar22 < pTVar21->m_cap)) goto LAB_001dd890;
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  else {
    this->m_state->node_id = uVar22;
    pTVar21 = this->m_tree;
    uVar14 = pTVar21->m_cap;
    pTVar13 = pTVar21;
    if (uVar22 == 0xffffffffffffffff || uVar14 <= uVar22) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pTVar13 = this->m_tree;
      uVar14 = pTVar13->m_cap;
    }
    NVar23 = (NodeType_e)((uint)pTVar21->m_buf[uVar22].m_type.type & 0x10);
    if ((uVar22 == 0xffffffffffffffff) || (uVar14 <= uVar22)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      uStack_130 = 0x4288;
      uStack_12e = 0x21;
      uStack_12c = 0;
      local_128 = 0x65;
      uStack_126 = 0;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar21 = this->m_tree;
    if ((pTVar13->m_buf[uVar22].m_type.type & SEQ) == NOTYPE) {
      bVar10 = Tree::has_children(pTVar21,uVar22);
      if (bVar10) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x53;
        local_148[9] = 'x';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_seq(this->m_tree,uVar22,NVar23);
    }
    else {
      if ((uVar22 == 0xffffffffffffffff) || (pTVar21->m_cap <= uVar22)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7d;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        uStack_130 = 0x4288;
        uStack_12e = 0x21;
        uStack_12c = 0;
        local_128 = 0x65;
        uStack_126 = 0;
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar15 = pTVar21->m_buf;
      NVar23 = NVar23 | pNVar15[uVar22].m_type.type;
      Tree::_check_next_flags(pTVar21,uVar22,NVar23);
      pNVar15[uVar22].m_type.type = NVar23;
    }
    _move_scalar_from_top(this);
    _write_val_anchor(this,uVar22);
    pcVar18 = (this->m_state->line_contents).rem.str;
    pTVar21 = this->m_tree;
    if ((uVar22 != 0xffffffffffffffff) && (uVar22 < pTVar21->m_cap)) goto LAB_001dd890;
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  local_148[0] = '\0';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\0';
  local_148[6] = '\0';
  local_148[7] = '\0';
  local_148[8] = -0x7d;
  local_148[9] = 'K';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_148[0xc] = '\0';
  local_148[0xd] = '\0';
  local_148[0xe] = '\0';
  local_148[0xf] = '\0';
  local_148[0x10] = '\0';
  local_148[0x11] = '\0';
  local_148[0x12] = '\0';
  local_148[0x13] = '\0';
  local_148[0x14] = '\0';
  local_148[0x15] = '\0';
  local_148[0x16] = '\0';
  local_148[0x17] = '\0';
  uStack_130 = 0x4288;
  uStack_12e = 0x21;
  uStack_12c = 0;
  local_128 = 0x65;
  uStack_126 = 0;
  (*(code *)PTR_error_impl_00247a78)
            ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
             (anonymous_namespace)::s_default_callbacks);
LAB_001dd890:
  pTVar21->m_buf[uVar22].m_val.scalar.str = pcVar18;
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar21 = this->m_tree;
    sVar20 = this->m_state->node_id;
    cVar25 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar21,sVar20,cVar25);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_seq(bool as_child)
{
    _c4dbgpf("start_seq (as child={})", as_child);
    if(has_all(RTOP|RUNK))
    {
        _c4dbgpf("start_seq: moving key tag to val tag: '{}'", m_key_tag);
        m_val_tag = m_key_tag;
        m_key_tag.clear();
    }
    addrem_flags(RSEQ|RVAL, RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(parent_id));
            type_bits key_quoted = 0;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_seq(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_seq: id={} name='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("start_seq[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            type_bits as_doc = 0;
            _RYML_CB_ASSERT(m_stack.m_callbacks, !m_tree->is_doc(m_state->node_id));
            m_tree->to_seq(m_state->node_id, as_doc);
            _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as doc" : "");
        }
        _write_val_anchor(m_state->node_id);
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    else
    {
        m_state->node_id = parent_id;
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_seq(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_seq(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as_doc" : "");
        _write_val_anchor(parent_id);
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("start_seq[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}